

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fNegativeStateApiTests.cpp
# Opt level: O3

void deqp::gles31::Functional::NegativeTestShared::get_active_uniformsiv(NegativeTestContext *ctx)

{
  RenderContext *renderCtx;
  void *pvVar1;
  GLuint GVar2;
  int iVar3;
  GLenum error;
  long lVar4;
  GLint numActiveUniforms;
  GLint dummyParamDst;
  vector<int,_std::allocator<int>_> dummyParamsDst;
  GLuint dummyUniformIndex;
  ProgramSources sources;
  ShaderProgram program;
  GLint local_318 [2];
  allocator_type local_30d;
  GLuint local_30c;
  string local_308;
  string local_2e8;
  string local_2c8;
  string local_2a8;
  undefined1 local_288 [8];
  iterator iStack_280;
  undefined1 local_278 [104];
  ios_base local_210 [24];
  vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_> local_1f8;
  undefined1 local_1d8 [216];
  ShaderProgram local_100;
  
  GVar2 = glu::CallLogWrapper::glCreateShader(&ctx->super_CallLogWrapper,0x8b31);
  renderCtx = ctx->m_renderCtx;
  local_2a8._M_dataplus._M_p = (pointer)&local_2a8.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_2a8,
             "${GLSL_VERSION_DECL}\nuniform mediump vec4 vUnif_vec4;\nin mediump vec4 attr;layout(shared) uniform Block { mediump vec4 blockVar; };\nvoid main (void)\n{\n\tgl_Position = vUnif_vec4 + blockVar + attr;\n}\n"
             ,"");
  getVtxFragVersionSources(&local_308,&local_2a8,(NegativeTestContext *)ctx->m_renderCtx);
  local_2c8._M_dataplus._M_p = (pointer)&local_2c8.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_2c8,
             "${GLSL_VERSION_DECL}\nuniform mediump ivec4 fUnif_ivec4;\nuniform mediump uvec4 fUnif_uvec4;\nlayout(location = 0) out mediump vec4 fragColor;void main (void)\n{\n\tfragColor = vec4(vec4(fUnif_ivec4) + vec4(fUnif_uvec4));\n}\n"
             ,"");
  getVtxFragVersionSources(&local_2e8,&local_2c8,(NegativeTestContext *)ctx->m_renderCtx);
  memset((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *)local_288,0,0xac);
  local_1d8._0_8_ = (pointer)0x0;
  local_1d8[8] = 0;
  local_1d8._9_7_ = 0;
  local_1d8[0x10] = 0;
  local_1d8._17_8_ = 0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_288,&local_308);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_278 + 8),&local_2e8);
  glu::ShaderProgram::ShaderProgram(&local_100,renderCtx,(ProgramSources *)local_288);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_1d8);
  std::vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_>::~vector
            (&local_1f8);
  lVar4 = 0x78;
  do {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_288 + lVar4));
    lVar4 = lVar4 + -0x18;
  } while (lVar4 != -0x18);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT44(local_2e8._M_dataplus._M_p._4_4_,local_2e8._M_dataplus._M_p._0_4_) !=
      &local_2e8.field_2) {
    operator_delete((undefined1 *)
                    CONCAT44(local_2e8._M_dataplus._M_p._4_4_,local_2e8._M_dataplus._M_p._0_4_),
                    local_2e8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2c8._M_dataplus._M_p != &local_2c8.field_2) {
    operator_delete(local_2c8._M_dataplus._M_p,local_2c8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT44(local_308._M_dataplus._M_p._4_4_,(uint)local_308._M_dataplus._M_p) !=
      &local_308.field_2) {
    operator_delete((undefined1 *)
                    CONCAT44(local_308._M_dataplus._M_p._4_4_,(uint)local_308._M_dataplus._M_p),
                    local_308.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2a8._M_dataplus._M_p != &local_2a8.field_2) {
    operator_delete(local_2a8._M_dataplus._M_p,local_2a8.field_2._M_allocated_capacity + 1);
  }
  local_2e8._M_dataplus._M_p._0_4_ = 1;
  local_318[1] = 0xffffffff;
  local_318[0] = -1;
  glu::CallLogWrapper::glUseProgram(&ctx->super_CallLogWrapper,local_100.m_program.m_program);
  glu::CallLogWrapper::glGetProgramiv
            (&ctx->super_CallLogWrapper,local_100.m_program.m_program,0x8b86,local_318);
  local_288 = (undefined1  [8])(ctx->super_CallLogWrapper).m_log;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&iStack_280);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&iStack_280,"// GL_ACTIVE_UNIFORMS = ",0x18);
  std::ostream::operator<<((ostringstream *)&iStack_280,local_318[0]);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&iStack_280," (expected 4).",0xe);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_288,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&iStack_280);
  std::ios_base::~ios_base(local_210);
  local_288 = (undefined1  [8])local_278;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_288,
             "GL_INVALID_VALUE is generated if program is not a value generated by OpenGL.","");
  NegativeTestContext::beginSection(ctx,(string *)local_288);
  if (local_288 != (undefined1  [8])local_278) {
    operator_delete((void *)local_288,(ulong)(local_278._0_8_ + 1));
  }
  glu::CallLogWrapper::glGetActiveUniformsiv
            (&ctx->super_CallLogWrapper,0xffffffff,1,(GLuint *)&local_2e8,0x8a37,local_318 + 1);
  NegativeTestContext::expectError(ctx,0x501);
  NegativeTestContext::endSection(ctx);
  local_288 = (undefined1  [8])local_278;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_288,
             "GL_INVALID_OPERATION is generated if program is not a program object.","");
  NegativeTestContext::beginSection(ctx,(string *)local_288);
  if (local_288 != (undefined1  [8])local_278) {
    operator_delete((void *)local_288,(ulong)(local_278._0_8_ + 1));
  }
  glu::CallLogWrapper::glGetActiveUniformsiv
            (&ctx->super_CallLogWrapper,GVar2,1,(GLuint *)&local_2e8,0x8a37,local_318 + 1);
  NegativeTestContext::expectError(ctx,0x502);
  NegativeTestContext::endSection(ctx);
  local_288 = (undefined1  [8])local_278;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_288,
             "GL_INVALID_VALUE is generated if any value in uniformIndices is greater than or equal to the value of GL_ACTIVE_UNIFORMS for program."
             ,"");
  NegativeTestContext::beginSection(ctx,(string *)local_288);
  local_30c = GVar2;
  if (local_288 != (undefined1  [8])local_278) {
    operator_delete((void *)local_288,(ulong)(local_278._0_8_ + 1));
  }
  iVar3 = -1;
  do {
    local_288 = (undefined1  [8])0x0;
    iStack_280._M_current = (uint *)0x0;
    local_278._0_8_ = (pointer)0x0;
    local_308._M_dataplus._M_p._0_4_ = 1;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_288,(iterator)0x0,
               (uint *)&local_308);
    local_308._M_dataplus._M_p._0_4_ = local_318[0] + iVar3;
    if (iStack_280._M_current == (uint *)local_278._0_8_) {
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_288,iStack_280,
                 (uint *)&local_308);
    }
    else {
      *iStack_280._M_current = (uint)local_308._M_dataplus._M_p;
      iStack_280._M_current = iStack_280._M_current + 1;
    }
    local_308._M_dataplus._M_p._0_4_ = 1;
    if (iStack_280._M_current == (uint *)local_278._0_8_) {
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_288,iStack_280,
                 (uint *)&local_308);
    }
    else {
      *iStack_280._M_current = 1;
      iStack_280._M_current = iStack_280._M_current + 1;
    }
    std::vector<int,_std::allocator<int>_>::vector
              ((vector<int,_std::allocator<int>_> *)&local_308,
               (long)iStack_280._M_current - (long)local_288 >> 2,&local_30d);
    glu::CallLogWrapper::glGetActiveUniformsiv
              (&ctx->super_CallLogWrapper,local_100.m_program.m_program,
               (GLsizei)((ulong)((long)iStack_280._M_current - (long)local_288) >> 2),
               (GLuint *)local_288,0x8a37,
               (GLint *)CONCAT44(local_308._M_dataplus._M_p._4_4_,(uint)local_308._M_dataplus._M_p))
    ;
    error = 0x501;
    if (iVar3 == -1) {
      error = 0;
    }
    NegativeTestContext::expectError(ctx,error);
    pvVar1 = (void *)CONCAT44(local_308._M_dataplus._M_p._4_4_,(uint)local_308._M_dataplus._M_p);
    if (pvVar1 != (void *)0x0) {
      operator_delete(pvVar1,local_308.field_2._M_allocated_capacity - (long)pvVar1);
    }
    if (local_288 != (undefined1  [8])0x0) {
      operator_delete((void *)local_288,local_278._0_8_ - (long)local_288);
    }
    iVar3 = iVar3 + 1;
  } while (iVar3 != 2);
  NegativeTestContext::endSection(ctx);
  GVar2 = local_30c;
  local_288 = (undefined1  [8])local_278;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_288,"GL_INVALID_ENUM is generated if pname is not an accepted token.",
             "");
  NegativeTestContext::beginSection(ctx,(string *)local_288);
  if (local_288 != (undefined1  [8])local_278) {
    operator_delete((void *)local_288,(ulong)(local_278._0_8_ + 1));
  }
  glu::CallLogWrapper::glGetActiveUniformsiv
            (&ctx->super_CallLogWrapper,local_100.m_program.m_program,1,(GLuint *)&local_2e8,
             0xffffffff,local_318 + 1);
  NegativeTestContext::expectError(ctx,0x500);
  NegativeTestContext::endSection(ctx);
  glu::CallLogWrapper::glUseProgram(&ctx->super_CallLogWrapper,0);
  glu::CallLogWrapper::glDeleteShader(&ctx->super_CallLogWrapper,GVar2);
  glu::ShaderProgram::~ShaderProgram(&local_100);
  return;
}

Assistant:

void get_active_uniformsiv (NegativeTestContext& ctx)
{
	GLuint					shader				= ctx.glCreateShader(GL_VERTEX_SHADER);
	glu::ShaderProgram		program				(ctx.getRenderContext(), glu::makeVtxFragSources(getVtxFragVersionSources(uniformTestVertSource, ctx), getVtxFragVersionSources(uniformTestFragSource, ctx)));
	GLuint					dummyUniformIndex	= 1;
	GLint					dummyParamDst		= -1;
	GLint					numActiveUniforms	= -1;

	ctx.glUseProgram(program.getProgram());

	ctx.glGetProgramiv	(program.getProgram(), GL_ACTIVE_UNIFORMS, &numActiveUniforms);
	ctx.getLog() << TestLog::Message << "// GL_ACTIVE_UNIFORMS = " << numActiveUniforms << " (expected 4)." << TestLog::EndMessage;

	ctx.beginSection("GL_INVALID_VALUE is generated if program is not a value generated by OpenGL.");
	ctx.glGetActiveUniformsiv(-1, 1, &dummyUniformIndex, GL_UNIFORM_TYPE, &dummyParamDst);
	ctx.expectError(GL_INVALID_VALUE);
	ctx.endSection();

	ctx.beginSection("GL_INVALID_OPERATION is generated if program is not a program object.");
	ctx.glGetActiveUniformsiv(shader, 1, &dummyUniformIndex, GL_UNIFORM_TYPE, &dummyParamDst);
	ctx.expectError(GL_INVALID_OPERATION);
	ctx.endSection();

	ctx.beginSection("GL_INVALID_VALUE is generated if any value in uniformIndices is greater than or equal to the value of GL_ACTIVE_UNIFORMS for program.");
	for (int excess = 0; excess <= 2; excess++)
	{
		std::vector<GLuint> invalidUniformIndices;
		invalidUniformIndices.push_back(1);
		invalidUniformIndices.push_back(numActiveUniforms-1+excess);
		invalidUniformIndices.push_back(1);

		std::vector<GLint> dummyParamsDst(invalidUniformIndices.size());
		ctx.glGetActiveUniformsiv(program.getProgram(), (GLsizei)invalidUniformIndices.size(), &invalidUniformIndices[0], GL_UNIFORM_TYPE, &dummyParamsDst[0]);
		ctx.expectError(excess == 0 ? GL_NO_ERROR : GL_INVALID_VALUE);
	}
	ctx.endSection();

	ctx.beginSection("GL_INVALID_ENUM is generated if pname is not an accepted token.");
	ctx.glGetActiveUniformsiv(program.getProgram(), 1, &dummyUniformIndex, -1, &dummyParamDst);
	ctx.expectError(GL_INVALID_ENUM);
	ctx.endSection();

	ctx.glUseProgram(0);
	ctx.glDeleteShader(shader);
}